

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O0

int bssl::SSL_SESSION_parse_crypto_buffer
              (CBS *cbs,UniquePtr<CRYPTO_BUFFER> *out,CBS_ASN1_TAG tag,CRYPTO_BUFFER_POOL *pool)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CRYPTO_BUFFER *__p;
  undefined1 local_50 [8];
  CBS value;
  CBS child;
  CRYPTO_BUFFER_POOL *pool_local;
  CBS_ASN1_TAG tag_local;
  UniquePtr<CRYPTO_BUFFER> *out_local;
  CBS *cbs_local;
  
  iVar2 = CBS_peek_asn1_tag(cbs,tag);
  if (iVar2 == 0) {
    cbs_local._4_4_ = 1;
  }
  else {
    iVar2 = CBS_get_asn1(cbs,(CBS *)&value.len,tag);
    if (((iVar2 != 0) && (iVar2 = CBS_get_asn1((CBS *)&value.len,(CBS *)local_50,4), iVar2 != 0)) &&
       (sVar3 = CBS_len((CBS *)&value.len), sVar3 == 0)) {
      __p = CRYPTO_BUFFER_new_from_CBS((CBS *)local_50,pool);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::reset(out,__p);
      bVar1 = std::operator==(out,(nullptr_t)0x0);
      if (!bVar1) {
        return 1;
      }
      return 0;
    }
    ERR_put_error(0x10,0,0xa0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                  ,0x19b);
    cbs_local._4_4_ = 0;
  }
  return cbs_local._4_4_;
}

Assistant:

static int SSL_SESSION_parse_crypto_buffer(CBS *cbs,
                                           UniquePtr<CRYPTO_BUFFER> *out,
                                           CBS_ASN1_TAG tag,
                                           CRYPTO_BUFFER_POOL *pool) {
  if (!CBS_peek_asn1_tag(cbs, tag)) {
    return 1;
  }

  CBS child, value;
  if (!CBS_get_asn1(cbs, &child, tag) ||
      !CBS_get_asn1(&child, &value, CBS_ASN1_OCTETSTRING) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return 0;
  }
  out->reset(CRYPTO_BUFFER_new_from_CBS(&value, pool));
  if (*out == nullptr) {
    return 0;
  }
  return 1;
}